

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

void __thiscall QFusionStyle::polish(QFusionStyle *this,QWidget *widget)

{
  bool bVar1;
  QAbstractButton *pQVar2;
  QComboBox *pQVar3;
  QProgressBar *pQVar4;
  QScrollBar *pQVar5;
  QSplitterHandle *pQVar6;
  QAbstractSlider *pQVar7;
  QAbstractSpinBox *pQVar8;
  QObject *in_RSI;
  bool in_stack_00000053;
  WidgetAttribute in_stack_00000054;
  QWidget *in_stack_00000058;
  QWidget *in_stack_ffffffffffffffe8;
  
  QCommonStyle::polish((QCommonStyle *)in_RSI,in_stack_ffffffffffffffe8);
  pQVar2 = qobject_cast<QAbstractButton*>((QObject *)0x4f4c6b);
  if ((((((pQVar2 != (QAbstractButton *)0x0) ||
         (pQVar3 = qobject_cast<QComboBox*>((QObject *)0x4f4c7f), pQVar3 != (QComboBox *)0x0)) ||
        (pQVar4 = qobject_cast<QProgressBar*>((QObject *)0x4f4c8f), pQVar4 != (QProgressBar *)0x0))
       || ((pQVar5 = qobject_cast<QScrollBar*>((QObject *)0x4f4c9f), pQVar5 != (QScrollBar *)0x0 ||
           (pQVar6 = qobject_cast<QSplitterHandle*>((QObject *)0x4f4caf),
           pQVar6 != (QSplitterHandle *)0x0)))) ||
      ((pQVar7 = qobject_cast<QAbstractSlider*>((QObject *)0x4f4cbf),
       pQVar7 != (QAbstractSlider *)0x0 ||
       ((pQVar8 = qobject_cast<QAbstractSpinBox*>((QObject *)0x4f4ccf),
        pQVar8 != (QAbstractSpinBox *)0x0 ||
        (bVar1 = QObject::inherits(in_RSI,(char *)in_stack_ffffffffffffffe8), bVar1)))))) ||
     (bVar1 = QObject::inherits(in_RSI,(char *)in_stack_ffffffffffffffe8), bVar1)) {
    QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
    QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
  }
  return;
}

Assistant:

void QFusionStyle::polish(QWidget *widget)
{
    QCommonStyle::polish(widget);
    if (false
#if QT_CONFIG(abstractbutton)
            || qobject_cast<QAbstractButton*>(widget)
#endif
#if QT_CONFIG(combobox)
            || qobject_cast<QComboBox *>(widget)
#endif
#if QT_CONFIG(progressbar)
            || qobject_cast<QProgressBar *>(widget)
#endif
#if QT_CONFIG(scrollbar)
            || qobject_cast<QScrollBar *>(widget)
#endif
#if QT_CONFIG(splitter)
            || qobject_cast<QSplitterHandle *>(widget)
#endif
#if QT_CONFIG(abstractslider)
            || qobject_cast<QAbstractSlider *>(widget)
#endif
#if QT_CONFIG(spinbox)
            || qobject_cast<QAbstractSpinBox *>(widget)
#endif
            || (widget->inherits("QDockSeparator"))
            || (widget->inherits("QDockWidgetSeparator"))
            ) {
        widget->setAttribute(Qt::WA_Hover, true);
        widget->setAttribute(Qt::WA_OpaquePaintEvent, false);
    }
}